

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

w_status wp_token_scan_flt_exponent(w_tokenizer *tokenizer,w_token_id *id,w_token_id id_on_success)

{
  char cVar1;
  w_status wVar2;
  ulong uVar3;
  char *msg;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x185);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x186);
  }
  if ((tokenizer->it[-1] != 'e') && (tokenizer->it[-1] != 'p')) {
    w_handle_failed_assertion
              ("tokenizer->it[-1] == \'e\' || tokenizer->it[-1] == \'p\'",
               "wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x187);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x188);
  }
  cVar1 = *tokenizer->it;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    tokenizer->it = tokenizer->it + 1;
    tokenizer->column = tokenizer->column + 1;
  }
  uVar3 = (ulong)(byte)*tokenizer->it;
  if (uVar3 < 0x3a) {
    if ((0x3ff000000000000U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0xac0100000401U >> (uVar3 & 0x3f) & 1) != 0) {
        msg = "unterminated floating-point exponent";
        goto LAB_00107e43;
      }
    }
    else {
      wp_token_consume_decimal_digits(tokenizer);
      if (((ulong)(byte)*tokenizer->it < 0x30) &&
         ((0xac0100000401U >> ((ulong)(byte)*tokenizer->it & 0x3f) & 1) != 0)) {
        *id = id_on_success;
        return W_SUCCESS;
      }
    }
  }
  msg = "not a valid floating-point exponent character";
LAB_00107e43:
  wVar2 = wp_token_add_error(tokenizer,msg);
  return wVar2;
}

Assistant:

static enum w_status
wp_token_scan_flt_exponent(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id,
    enum w_token_id id_on_success
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(tokenizer->it[-1] == 'e' || tokenizer->it[-1] == 'p');
    W_ASSERT(id != NULL);

    if (*tokenizer->it == '+' || *tokenizer->it == '-')
    {
        wp_token_advance_iter(tokenizer);
    }

    switch (*tokenizer->it)
    {
        case WP_TOKEN_CASE_DECIMAL_DIGITS:
        {
            wp_token_consume_decimal_digits(tokenizer);
            switch (*tokenizer->it)
            {
                case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
                {
                    *id = id_on_success;
                    return W_SUCCESS;
                }
                default:
                {
                    return wp_token_add_error(
                        tokenizer,
                        WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                            "floating-point exponent"
                        )
                    );
                }
            }
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_UNTERMINATED("floating-point exponent")
            );
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR("floating-point exponent")
            );
        }
    }
}